

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVirtualProtocol.h
# Opt level: O2

void __thiscall
duckdb_apache::thrift::protocol::
TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
::TVirtualProtocol(TVirtualProtocol<duckdb_apache::thrift::protocol::TCompactProtocolT<duckdb::DecryptionTransport>,_duckdb_apache::thrift::protocol::TProtocolDefaults>
                   *this,shared_ptr<duckdb_apache::thrift::transport::TTransport> *ptrans)

{
  __shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr(&local_20,
               &ptrans->
                super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              );
  TProtocolDefaults::TProtocolDefaults
            (&this->super_TProtocolDefaults,
             (shared_ptr<duckdb_apache::thrift::transport::TTransport> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_TProtocolDefaults).super_TProtocol._vptr_TProtocol =
       (_func_int **)&PTR__TProtocol_027dc690;
  return;
}

Assistant:

TVirtualProtocol(std::shared_ptr<TTransport> ptrans) : Super_(ptrans) {}